

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_common.hpp
# Opt level: O3

void unodb::detail::dump_key<unsigned_long>(ostream *os,unsigned_long key)

{
  long lVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"key: 0x",7);
  lVar1 = *(long *)os;
  *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = os + *(long *)(lVar1 + -0x18);
  if (os[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar2);
    poVar2[0xe1] = (ostream)0x1;
    lVar1 = *(long *)os;
  }
  poVar2[0xe0] = (ostream)0x30;
  *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 0x10) = 8;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  return;
}

Assistant:

[[gnu::cold]] void dump_key(std::ostream &os, T key) {
  if constexpr (std::is_same_v<T, key_view>) {
    const auto sz = key.size_bytes();
    os << "key(" << sz << "): 0x";
    for (std::size_t i = 0; i < sz; ++i) unodb::detail::dump_byte(os, key[i]);
  } else {
    os << "key: 0x" << std::hex << std::setfill('0') << std::setw(sizeof(key))
       << key << std::dec;
  }
}